

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseFloatingLiteral
                 (char *in,char *end,Value **floating,ValueType floatType)

{
  byte bVar1;
  byte *pbVar2;
  Value *pVVar3;
  byte *in_00;
  byte *pbVar4;
  double value;
  
  *floating = (Value *)0x0;
  if (in == end || in == (char *)0x0) {
    return in;
  }
  do {
    pbVar2 = (byte *)in;
    pbVar4 = (byte *)in;
    in_00 = (byte *)in;
    if ((0x2c < (ulong)(byte)*in) ||
       (pbVar4 = (byte *)in, (0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0)) break;
    in = (char *)((byte *)in + 1);
    pbVar2 = (byte *)end;
    pbVar4 = (byte *)end;
    in_00 = (byte *)end;
  } while (in != end);
  do {
    if (pbVar2 == (byte *)end) {
LAB_0068d08c:
      bVar1 = *in_00;
      if (((bVar1 == 0x30) && (in_00 + 1 != (byte *)end)) && ((in_00[1] + 0xa8 & 0xdf) == 0)) {
        parseHexaLiteral((char *)in_00,end,floating);
        return (char *)pbVar4;
      }
      if (9 < (byte)(bVar1 - 0x30)) {
        if (bVar1 != 0x2d) {
          return (char *)pbVar4;
        }
        if (9 < (byte)(in_00[1] - 0x30)) {
          return (char *)pbVar4;
        }
      }
      value = atof((char *)in_00);
      if (floatType == ddl_double) {
        pVVar3 = ValueAllocator::allocPrimData(ddl_double,1);
        *floating = pVVar3;
        Value::setDouble(pVVar3,value);
        return (char *)pbVar4;
      }
      pVVar3 = ValueAllocator::allocPrimData(ddl_float,1);
      *floating = pVVar3;
      Value::setFloat(pVVar3,(float)value);
      return (char *)pbVar4;
    }
    bVar1 = *pbVar2;
    pbVar4 = pbVar2;
    if ((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
       ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
    goto LAB_0068d08c;
    pbVar2 = pbVar2 + 1;
    pbVar4 = (byte *)end;
  } while( true );
}

Assistant:

char *OpenDDLParser::parseFloatingLiteral( char *in, char *end, Value **floating, Value::ValueType floatType) {
    *floating = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
    }

    // parse the float value
    bool ok( false );
    if ( isHexLiteral( start, end ) ) {
        parseHexaLiteral( start, end, floating );
        return in;
    }

    if( isNumeric( *start ) ) {
        ok = true;
    } else {
        if( *start == '-' ) {
            if( isNumeric( *(start+1) ) ) {
                ok = true;
            }
        }
    }

    if( ok ) {
        if ( floatType == Value::ddl_double ) {
            const double value( atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_double );
            ( *floating )->setDouble( value );
        } else {
            const float value( ( float ) atof( start ) );
            *floating = ValueAllocator::allocPrimData( Value::ddl_float );
            ( *floating )->setFloat( value );
        }
    }

    return in;
}